

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall
SchnorrSig_SetSigHashType_Test::SchnorrSig_SetSigHashType_Test(SchnorrSig_SetSigHashType_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c5bf0;
  return;
}

Assistant:

TEST(SchnorrSig, SetSigHashType) {
  SchnorrSignature sig(
    "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee"
    "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8");
  sig.SetSigHashType(SigHashType(SigHashAlgorithm::kSigHashAll));
  EXPECT_EQ(SigHashAlgorithm::kSigHashAll,
      sig.GetSigHashType().GetSigHashAlgorithm());
}